

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::RangeEnc_ShiftLow(CRangeEnc *p)

{
  UInt64 UVar1;
  Byte *pBVar2;
  Byte *buf;
  Byte temp;
  CRangeEnc *p_local;
  
  if (((uint)p->low < 0xff000000) || ((int)(p->low >> 0x20) != 0)) {
    buf._7_1_ = p->cache;
    do {
      pBVar2 = p->buf + 1;
      *p->buf = buf._7_1_ + (char)(p->low >> 0x20);
      p->buf = pBVar2;
      if (pBVar2 == p->bufLim) {
        RangeEnc_FlushStream(p);
      }
      buf._7_1_ = 0xff;
      UVar1 = p->cacheSize - 1;
      p->cacheSize = UVar1;
    } while (UVar1 != 0);
    p->cache = (Byte)(p->low >> 0x18);
  }
  p->cacheSize = p->cacheSize + 1;
  p->low = (ulong)(uint)((int)p->low << 8);
  return;
}

Assistant:

static void MY_FAST_CALL RangeEnc_ShiftLow(CRangeEnc* p) {
  if ((UInt32)p->low < (UInt32)0xFF000000 || (int)(p->low >> 32) != 0) {
    Byte temp = p->cache;
    do {
      Byte* buf = p->buf;
      *buf++ = (Byte)(temp + (Byte)(p->low >> 32));
      p->buf = buf;
      if (buf == p->bufLim)
        RangeEnc_FlushStream(p);
      temp = 0xFF;
    } while (--p->cacheSize != 0);
    p->cache = (Byte)((UInt32)p->low >> 24);
  }
  p->cacheSize++;
  p->low = (UInt32)p->low << 8;
}